

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::prepareNextTestCase
          (BindingImagesTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  GLchar *__s;
  size_t sVar1;
  uint uVar2;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  uVar2 = test_case_index + 1;
  if (uVar2 < 9) {
    this->m_test_case = *(TEXTURE_TYPES *)(&DAT_01a82b5c + (ulong)uVar2 * 4);
    local_198._0_8_ =
         ((this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.m_context)
         ->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Tested texture type: ",0x15);
    __s = Utils::getTextureTypeName(this->m_test_case);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  return uVar2 < 9;
}

Assistant:

bool BindingImagesTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		m_test_case = Utils::TEX_2D;
		break;
	case 1:
		m_test_case = Utils::TEX_BUFFER;
		break;
	case 2:
		m_test_case = Utils::TEX_2D_RECT;
		break;
	case 3:
		m_test_case = Utils::TEX_2D_ARRAY;
		break;
	case 4:
		m_test_case = Utils::TEX_3D;
		break;
	case 5:
		m_test_case = Utils::TEX_CUBE;
		break;
	case 6:
		m_test_case = Utils::TEX_1D;
		break;
	case 7:
		m_test_case = Utils::TEX_1D_ARRAY;
		break;
	default:
		return false;
		break;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Tested texture type: " << Utils::getTextureTypeName(m_test_case)
										<< tcu::TestLog::EndMessage;

	return true;
}